

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O1

vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *
vectors_difference(vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                   *__return_storage_ptr__,
                  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v1,
                  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *v2)

{
  pointer pVVar1;
  pointer pVVar2;
  long lVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar1 = (v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar1 != pVVar2) {
    uVar4 = (long)pVVar2 - (long)pVVar1 >> 4;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar1,pVVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar1,pVVar2);
  }
  pVVar1 = (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar1 != pVVar2) {
    uVar4 = (long)pVVar2 - (long)pVVar1 >> 4;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar1,pVVar2,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pVVar1,pVVar2);
  }
  std::
  __set_difference<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,std::back_insert_iterator<std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (v1->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (v2->super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>)._M_impl.
             super__Vector_impl_data._M_finish,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

vector<mir::inst::VarId> vectors_difference(vector<mir::inst::VarId> v1,
                                            vector<mir::inst::VarId> v2) {
  vector<mir::inst::VarId> v;
  sort(v1.begin(), v1.end());
  sort(v2.begin(), v2.end());
  set_difference(v1.begin(), v1.end(), v2.begin(), v2.end(), back_inserter(v));
  return v;
}